

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

void __thiscall flow::TargetCodeGenerator::emitLoad(TargetCodeGenerator *this,Value *value)

{
  undefined8 uVar1;
  Operand op1;
  size_t sVar2;
  StackPointer SVar3;
  StackPointer SVar4;
  undefined8 extraout_RAX;
  Opcode OVar5;
  long lVar6;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar7;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source;
  Family *pFVar8;
  undefined8 *puVar9;
  IPAddress *pIVar10;
  Cidr *pCVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_80 [80];
  
  bVar12 = 0;
  if (value == (Value *)0x0) {
    lVar6 = 0;
  }
  else {
    auVar13 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    in_RDX = auVar13._8_8_;
    lVar6 = auVar13._0_8_;
  }
  if (lVar6 != 0) {
    sVar2 = *(size_t *)(lVar6 + 0x48);
    OVar5 = ILOAD;
    if (0xffff < (long)sVar2) {
      sVar2 = ConstantPool::makeInteger(&this->cp_,sVar2);
      OVar5 = NLOAD;
    }
    emitInstr(this,OVar5,(Operand)sVar2);
    changeStack(this,0,value);
    in_RDX = extraout_RDX;
    if (lVar6 != 0) {
      return;
    }
  }
  if (value == (Value *)0x0) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = in_RDX;
    auVar13 = auVar13 << 0x40;
  }
  else {
    auVar13 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
  }
  if (auVar13._0_8_ != 0) {
    emitInstr(this,ILOAD,(ushort)*(byte *)(auVar13._0_8_ + 0x48));
    changeStack(this,0,value);
    return;
  }
  if (value == (Value *)0x0) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar13._8_8_;
    auVar14 = auVar14 << 0x40;
  }
  else {
    auVar14 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
  }
  uVar7 = auVar14._8_8_;
  lVar6 = auVar14._0_8_;
  if (lVar6 != 0) {
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,*(long *)(lVar6 + 0x48),
               *(long *)(lVar6 + 0x50) + *(long *)(lVar6 + 0x48));
    sVar2 = ConstantPool::makeString(&this->cp_,(string *)local_80);
    emitInstr(this,SLOAD,(Operand)sVar2);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    changeStack(this,0,value);
    uVar7 = extraout_RDX_00;
    if (lVar6 != 0) {
      return;
    }
  }
  if (value == (Value *)0x0) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar7;
    auVar15 = auVar15 << 0x40;
  }
  else {
    auVar15 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::typeinfo,0)
    ;
  }
  if (auVar15._0_8_ != 0) {
    pFVar8 = (Family *)(auVar15._0_8_ + 0x48);
    pIVar10 = (IPAddress *)local_80;
    for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
      pIVar10->family_ = *pFVar8;
      pFVar8 = pFVar8 + (ulong)bVar12 * -2 + 1;
      pIVar10 = (IPAddress *)((long)pIVar10 + (ulong)bVar12 * -8 + 4);
    }
    sVar2 = ConstantPool::makeIPAddress(&this->cp_,(IPAddress *)local_80);
    op1 = (Operand)sVar2;
    OVar5 = PLOAD;
LAB_0013a040:
    emitInstr(this,OVar5,op1);
    changeStack(this,0,value);
    return;
  }
  if (value == (Value *)0x0) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auVar15._8_8_;
    auVar16 = auVar16 << 0x40;
  }
  else {
    auVar16 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<flow::util::Cidr,(flow::LiteralType)6>::typeinfo,0);
  }
  if (auVar16._0_8_ != 0) {
    puVar9 = (undefined8 *)(auVar16._0_8_ + 0x48);
    pCVar11 = (Cidr *)local_80;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar1 = *puVar9;
      (pCVar11->ipaddr_).family_ = (int)uVar1;
      (pCVar11->ipaddr_).cstr_[0] = (char)((ulong)uVar1 >> 0x20);
      (pCVar11->ipaddr_).cstr_[1] = (char)((ulong)uVar1 >> 0x28);
      (pCVar11->ipaddr_).cstr_[2] = (char)((ulong)uVar1 >> 0x30);
      (pCVar11->ipaddr_).cstr_[3] = (char)((ulong)uVar1 >> 0x38);
      puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
      pCVar11 = (Cidr *)((long)pCVar11 + (ulong)bVar12 * -0x10 + 8);
    }
    sVar2 = ConstantPool::makeCidr(&this->cp_,(Cidr *)local_80);
    op1 = (Operand)sVar2;
    OVar5 = CLOAD;
    goto LAB_0013a040;
  }
  if (value == (Value *)0x0) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = auVar16._8_8_;
    auVar17 = auVar17 << 0x40;
  }
  else {
    auVar17 = __dynamic_cast(value,&Value::typeinfo,&ConstantArray::typeinfo,0);
  }
  source = auVar17._8_8_;
  lVar6 = auVar17._0_8_;
  if (lVar6 != 0) {
    switch(*(undefined4 *)(lVar6 + 8)) {
    case 9:
      convert<long,flow::ConstantValue<long,(flow::LiteralType)2>>
                ((vector<long,_std::allocator<long>_> *)local_80,(flow *)(lVar6 + 0x48),source);
      sVar2 = ConstantPool::makeIntegerArray
                        (&this->cp_,(vector<long,_std::allocator<long>_> *)local_80);
      emitInstr(this,ITLOAD,(Operand)sVar2);
      break;
    case 10:
      convert<std::__cxx11::string,flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_80,(flow *)(lVar6 + 0x48),source);
      sVar2 = ConstantPool::makeStringArray
                        (&this->cp_,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_80);
      emitInstr(this,STLOAD,(Operand)sVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_80);
      goto LAB_0013a1a2;
    case 0xb:
      convert<flow::util::IPAddress,flow::ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>>
                ((vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> *)local_80,
                 (flow *)(lVar6 + 0x48),source);
      sVar2 = ConstantPool::makeIPaddrArray
                        (&this->cp_,
                         (vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> *)
                         local_80);
      emitInstr(this,PTLOAD,(Operand)sVar2);
      break;
    case 0xc:
      convert<flow::util::Cidr,flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>
                ((vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)local_80,
                 (flow *)(lVar6 + 0x48),source);
      sVar2 = ConstantPool::makeCidrArray
                        (&this->cp_,
                         (vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)local_80);
      emitInstr(this,CTLOAD,(Operand)sVar2);
      break;
    default:
      goto switchD_0013a0ad_default;
    }
    if ((pointer)local_80._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ - local_80._0_8_);
    }
LAB_0013a1a2:
    changeStack(this,0,value);
    if (lVar6 != 0) {
      return;
    }
  }
  if (value == (Value *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::typeinfo,0);
  }
  if (lVar6 != 0) {
    util::RegExp::RegExp((RegExp *)local_80,(RegExp *)(lVar6 + 0x48));
    sVar2 = ConstantPool::makeRegExp(&this->cp_,(RegExp *)local_80);
    emitInstr(this,ILOAD,(Operand)sVar2);
    util::RegExp::~RegExp((RegExp *)local_80);
    changeStack(this,0,value);
    if (lVar6 != 0) {
      return;
    }
  }
  SVar3 = getStackPointer(this,value);
  if (SVar3 != 0xffffffffffffffff) {
    SVar4 = getStackPointer(this);
    if (SVar3 != SVar4 - 1) {
      if ((long)(value->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(value->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
                _M_impl.super__Vector_impl_data._M_start == 8) {
        emitInstr(this,STACKROT,(Operand)SVar3);
      }
      else {
        emitInstr(this,LOAD,(Operand)SVar3);
        push(this,value);
      }
    }
    return;
  }
  emitLoad();
switchD_0013a0ad_default:
  emitLoad();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void TargetCodeGenerator::emitLoad(Value* value) {
  // const int
  if (auto integer = dynamic_cast<ConstantInt*>(value)) {
    // FIXME this constant initialization should pretty much be done in the entry block
    FlowNumber number = integer->get();
    if (number <= std::numeric_limits<Operand>::max()) {
      emitInstr(Opcode::ILOAD, number);
      changeStack(0, value);
    } else {
      emitInstr(Opcode::NLOAD, cp_.makeInteger(number));
      changeStack(0, value);
    }
    return;
  }

  // const boolean
  if (auto boolean = dynamic_cast<ConstantBoolean*>(value)) {
    emitInstr(Opcode::ILOAD, boolean->get());
    changeStack(0, value);
    return;
  }

  // const string
  if (auto str = dynamic_cast<ConstantString*>(value)) {
    emitInstr(Opcode::SLOAD, cp_.makeString(str->get()));
    changeStack(0, value);
    return;
  }

  // const ip
  if (auto ip = dynamic_cast<ConstantIP*>(value)) {
    emitInstr(Opcode::PLOAD, cp_.makeIPAddress(ip->get()));
    changeStack(0, value);
    return;
  }

  // const cidr
  if (auto cidr = dynamic_cast<ConstantCidr*>(value)) {
    emitInstr(Opcode::CLOAD, cp_.makeCidr(cidr->get()));
    changeStack(0, value);
    return;
  }

  // const array<T>
  if (auto array = dynamic_cast<ConstantArray*>(value)) {
    switch (array->type()) {
      case LiteralType::IntArray:
        emitInstr(Opcode::ITLOAD,
             cp_.makeIntegerArray(
                 convert<FlowNumber, ConstantInt>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::StringArray:
        emitInstr(Opcode::STLOAD,
             cp_.makeStringArray(
                 convert<std::string, ConstantString>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::IPAddrArray:
        emitInstr(Opcode::PTLOAD,
             cp_.makeIPaddrArray(convert<util::IPAddress, ConstantIP>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::CidrArray:
        emitInstr(Opcode::CTLOAD,
             cp_.makeCidrArray(convert<util::Cidr, ConstantCidr>(array->get())));
        changeStack(0, value);
        break;
      default:
        fprintf(stderr, "BUG: Unsupported array type in target code generator.");
        abort();
    }
    return;
  }

  // const regex
  if (auto re = dynamic_cast<ConstantRegExp*>(value)) {
    // TODO emitInstr(Opcode::RLOAD, re->get());
    emitInstr(Opcode::ILOAD, cp_.makeRegExp(re->get()));
    changeStack(0, value);
    return;
  }

  // if value is already on stack, dup to top
  StackPointer si = getStackPointer(value);
  FLOW_ASSERT(si != static_cast<size_t>(-1),
              "BUG: emitLoad: value not yet on the stack but referenced as operand.");

  if (si == getStackPointer() - 1)
    return;

  if (value->useCount() == 1) {
    // XXX only used once, so move value to stack top
    emitInstr(Opcode::STACKROT, si);
    return;
  }

  // XXX duplicate value onto stack top
  emitInstr(Opcode::LOAD, si);
  push(value);
}